

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# container_memory.h
# Opt level: O2

size_t absl::lts_20240722::container_internal::
       TypeErasedApplyToSlotFn<google::protobuf::(anonymous_namespace)::DescriptorsByNameHash<google::protobuf::Descriptor>,google::protobuf::Descriptor_const*>
                 (void *fn,void *slot)

{
  size_t sVar1;
  
  sVar1 = HashOf<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    (*(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                      (*slot + 8));
  return sVar1;
}

Assistant:

size_t TypeErasedApplyToSlotFn(const void* fn, void* slot) {
  const auto* f = static_cast<const Fn*>(fn);
  return (*f)(*static_cast<const T*>(slot));
}